

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::param::Chart::Chart
          (Chart *this,ChartCtorBuffers *buffers,Chart *parent,Mesh *parentMesh,
          ConstArrayView<unsigned_int> faces,Vector2 *texcoords,Mesh *originalMesh,uint32_t meshId,
          uint32_t chartGroupId,uint32_t chartId)

{
  uint uVar1;
  Array<xatlas::internal::Vector3> *pAVar2;
  Chart *this_00;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Enum EVar6;
  uint *puVar7;
  Mesh *pMVar8;
  Vector3 *pVVar9;
  Vector3 *v1;
  float fVar10;
  uint32_t index2;
  uint32_t index1;
  int i_3;
  Enum result;
  uint32_t vertex_1;
  uint32_t i_2;
  uint32_t unifiedIndices [3];
  uint32_t indices [3];
  uint32_t f_1;
  Vector3 local_8c;
  uint32_t local_80;
  uint32_t local_7c;
  uint32_t parentVertex;
  uint32_t unifiedVertex;
  uint32_t vertex;
  uint32_t i_1;
  uint32_t f;
  Array<unsigned_int> *unifiedMeshIndices;
  Chart *local_58;
  Array<unsigned_int> *chartMeshIndices;
  uint local_48;
  uint32_t i;
  uint32_t faceCount;
  Mesh *local_38;
  Mesh *parentMesh_local;
  Chart *parent_local;
  ChartCtorBuffers *buffers_local;
  Chart *this_local;
  ConstArrayView<unsigned_int> faces_local;
  
  this_local = (Chart *)faces.data;
  faces_local.data._0_4_ = faces.length;
  local_38 = parentMesh;
  parentMesh_local = (Mesh *)parent;
  parent_local = (Chart *)buffers;
  buffers_local = (ChartCtorBuffers *)this;
  Basis::Basis(&this->m_basis);
  this->m_mesh = (Mesh *)0x0;
  this->m_unifiedMesh = (Mesh *)0x0;
  this->m_unmodifiedUnifiedMesh = (Mesh *)0x0;
  this->m_type = Piecewise;
  this->m_warningFlags = 0;
  this->m_closedHolesCount = 0;
  this->m_fixedTJunctionsCount = 0;
  Array<unsigned_int>::Array(&this->m_faceArray,0);
  Array<unsigned_int>::Array(&this->m_chartToOriginalMap,0);
  Array<unsigned_int>::Array(&this->m_chartToUnifiedMap,0);
  Quality::Quality(&this->m_quality);
  this->m_initialFaceCount = (uint32_t)faces_local.data;
  local_48 = (uint32_t)faces_local.data;
  Array<unsigned_int>::resize(&this->m_faceArray,(uint32_t)faces_local.data);
  for (chartMeshIndices._4_4_ = 0; chartMeshIndices._4_4_ < local_48;
      chartMeshIndices._4_4_ = chartMeshIndices._4_4_ + 1) {
    pAVar2 = &parentMesh_local->m_positions;
    puVar7 = ConstArrayView<unsigned_int>::operator[]
                       ((ConstArrayView<unsigned_int> *)&this_local,chartMeshIndices._4_4_);
    puVar7 = Array<unsigned_int>::operator[]
                       ((Array<unsigned_int> *)&(pAVar2->m_base).capacity,*puVar7);
    uVar1 = *puVar7;
    puVar7 = Array<unsigned_int>::operator[](&this->m_faceArray,chartMeshIndices._4_4_);
    *puVar7 = uVar1;
  }
  pMVar8 = (Mesh *)Realloc((void *)0x0,0x1c0,5,
                           "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                           ,0x1a7b);
  fVar10 = Mesh::epsilon(originalMesh);
  uVar4 = Array<unsigned_int>::size(&this->m_faceArray);
  uVar5 = Array<unsigned_int>::size(&this->m_faceArray);
  Mesh::Mesh(pMVar8,fVar10,uVar4 * 3,uVar5,0,0xffffffff);
  this->m_mesh = pMVar8;
  pMVar8 = (Mesh *)Realloc((void *)0x0,0x1c0,5,
                           "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                           ,0x1a7c);
  fVar10 = Mesh::epsilon(originalMesh);
  uVar4 = Array<unsigned_int>::size(&this->m_faceArray);
  uVar5 = Array<unsigned_int>::size(&this->m_faceArray);
  Mesh::Mesh(pMVar8,fVar10,uVar4 * 3,uVar5,0,0xffffffff);
  this_00 = parent_local;
  this->m_unifiedMesh = pMVar8;
  local_58 = parent_local;
  uVar4 = Mesh::vertexCount(originalMesh);
  Array<unsigned_int>::resize((Array<unsigned_int> *)this_00,uVar4);
  unifiedMeshIndices._4_4_ = 0xffffffff;
  Array<unsigned_int>::setAll
            ((Array<unsigned_int> *)local_58,(uint *)((long)&unifiedMeshIndices + 4));
  pVVar9 = &(parent_local->m_basis).normal;
  _f = pVVar9;
  uVar4 = Mesh::vertexCount(originalMesh);
  Array<unsigned_int>::resize((Array<unsigned_int> *)pVVar9,uVar4);
  i_1 = 0xffffffff;
  Array<unsigned_int>::setAll((Array<unsigned_int> *)_f,&i_1);
  vertex = 0;
  do {
    if (local_48 <= vertex) {
      indices[1] = 0;
      while( true ) {
        if (local_48 <= indices[1]) {
          Mesh::createBoundaries(this->m_mesh);
          Mesh::createBoundaries(this->m_unifiedMesh);
          Mesh::linkBoundaries(this->m_unifiedMesh);
          return;
        }
        for (result = OK; result < 3; result = result + DuplicateEdge) {
          puVar7 = Array<unsigned_int>::operator[](&this->m_faceArray,indices[1]);
          uVar4 = Mesh::vertexAt(originalMesh,*puVar7 * 3 + result);
          puVar7 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_58,uVar4);
          unifiedIndices[(ulong)result + 1] = *puVar7;
          pVVar9 = _f;
          uVar4 = Mesh::firstColocal(originalMesh,uVar4);
          puVar7 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)pVVar9,uVar4);
          (&vertex_1)[result] = *puVar7;
        }
        EVar6 = Mesh::addFace(this->m_mesh,unifiedIndices + 1,false,true);
        if (EVar6 != OK) break;
        for (index2 = 0; (int)index2 < 3; index2 = index2 + 1) {
          if ((&vertex_1)[(int)index2] == (&vertex_1)[(int)(index2 + 1) % 3]) {
            __assert_fail("index1 != index2",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x1aa6,
                          "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                         );
          }
        }
        EVar6 = Mesh::addFace(this->m_unifiedMesh,&vertex_1,false,true);
        if (EVar6 != OK) {
          __assert_fail("result == Mesh::AddFaceResult::OK",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x1aab,
                        "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                       );
        }
        indices[1] = indices[1] + 1;
      }
      __assert_fail("result == Mesh::AddFaceResult::OK",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x1aa0,
                    "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    for (unifiedVertex = 0; unifiedVertex < 3; unifiedVertex = unifiedVertex + 1) {
      puVar7 = Array<unsigned_int>::operator[](&this->m_faceArray,vertex);
      parentVertex = Mesh::vertexAt(originalMesh,*puVar7 * 3 + unifiedVertex);
      local_7c = Mesh::firstColocal(originalMesh,parentVertex);
      pMVar8 = local_38;
      puVar7 = ConstArrayView<unsigned_int>::operator[]
                         ((ConstArrayView<unsigned_int> *)&this_local,vertex);
      local_80 = Mesh::vertexAt(pMVar8,*puVar7 * 3 + unifiedVertex);
      puVar7 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)_f,local_7c);
      if (*puVar7 == 0xffffffff) {
        uVar4 = Mesh::vertexCount(this->m_unifiedMesh);
        puVar7 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)_f,local_7c);
        *puVar7 = uVar4;
        pVVar9 = Mesh::position(originalMesh,parentVertex);
        v1 = Mesh::position(originalMesh,local_7c);
        fVar10 = Mesh::epsilon(originalMesh);
        bVar3 = equal(pVVar9,v1,fVar10);
        if (!bVar3) {
          __assert_fail("equal(originalMesh->position(vertex), originalMesh->position(unifiedVertex), originalMesh->epsilon())"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x1a8b,
                        "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                       );
        }
        pMVar8 = this->m_unifiedMesh;
        pVVar9 = Mesh::position(originalMesh,parentVertex);
        Vector3::Vector3(&local_8c,0.0);
        Mesh::addVertex(pMVar8,pVVar9,&local_8c,texcoords + local_80);
      }
      puVar7 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_58,parentVertex);
      if (*puVar7 == 0xffffffff) {
        uVar4 = Mesh::vertexCount(this->m_mesh);
        puVar7 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_58,parentVertex);
        *puVar7 = uVar4;
        Array<unsigned_int>::push_back(&this->m_chartToOriginalMap,&parentVertex);
        puVar7 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)_f,local_7c);
        Array<unsigned_int>::push_back(&this->m_chartToUnifiedMap,puVar7);
        pMVar8 = this->m_mesh;
        pVVar9 = Mesh::position(originalMesh,parentVertex);
        Vector3::Vector3((Vector3 *)(indices + 2),0.0);
        Mesh::addVertex(pMVar8,pVVar9,(Vector3 *)(indices + 2),texcoords + local_80);
      }
    }
    vertex = vertex + 1;
  } while( true );
}

Assistant:

Chart(ChartCtorBuffers &buffers, const Chart *parent, const Mesh *parentMesh, ConstArrayView<uint32_t> faces, const Vector2 *texcoords, const Mesh *originalMesh, uint32_t meshId, uint32_t chartGroupId, uint32_t chartId) : m_mesh(nullptr), m_unifiedMesh(nullptr), m_unmodifiedUnifiedMesh(nullptr), m_type(ChartType::Piecewise), m_warningFlags(0), m_closedHolesCount(0), m_fixedTJunctionsCount(0)
	{
		XA_UNUSED(meshId);
		XA_UNUSED(chartGroupId);
		XA_UNUSED(chartId);
		const uint32_t faceCount = m_initialFaceCount = faces.length;
		m_faceArray.resize(faceCount);
		for (uint32_t i = 0; i < faceCount; i++)
			m_faceArray[i] = parent->m_faceArray[faces[i]]; // Map faces to parent chart original mesh.
		// Copy face indices.
		m_mesh = XA_NEW_ARGS(MemTag::Mesh, Mesh, originalMesh->epsilon(), m_faceArray.size() * 3, m_faceArray.size());
		m_unifiedMesh = XA_NEW_ARGS(MemTag::Mesh, Mesh, originalMesh->epsilon(), m_faceArray.size() * 3, m_faceArray.size());
		Array<uint32_t> &chartMeshIndices = buffers.chartMeshIndices;
		chartMeshIndices.resize(originalMesh->vertexCount());
		chartMeshIndices.setAll(UINT32_MAX);
		Array<uint32_t> &unifiedMeshIndices = buffers.unifiedMeshIndices;
		unifiedMeshIndices.resize(originalMesh->vertexCount());
		unifiedMeshIndices.setAll(UINT32_MAX);
		// Add vertices.
		for (uint32_t f = 0; f < faceCount; f++) {
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = originalMesh->vertexAt(m_faceArray[f] * 3 + i);
				const uint32_t unifiedVertex = originalMesh->firstColocal(vertex);
				const uint32_t parentVertex = parentMesh->vertexAt(faces[f] * 3 + i);
				if (unifiedMeshIndices[unifiedVertex] == (uint32_t)~0) {
					unifiedMeshIndices[unifiedVertex] = m_unifiedMesh->vertexCount();
					XA_DEBUG_ASSERT(equal(originalMesh->position(vertex), originalMesh->position(unifiedVertex), originalMesh->epsilon()));
					m_unifiedMesh->addVertex(originalMesh->position(vertex), Vector3(0.0f), texcoords[parentVertex]);
				}
				if (chartMeshIndices[vertex] == (uint32_t)~0) {
					chartMeshIndices[vertex] = m_mesh->vertexCount();
					m_chartToOriginalMap.push_back(vertex);
					m_chartToUnifiedMap.push_back(unifiedMeshIndices[unifiedVertex]);
					m_mesh->addVertex(originalMesh->position(vertex), Vector3(0.0f), texcoords[parentVertex]);
				}
			}
		}
		// Add faces.
		for (uint32_t f = 0; f < faceCount; f++) {
			uint32_t indices[3], unifiedIndices[3];
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = originalMesh->vertexAt(m_faceArray[f] * 3 + i);
				indices[i] = chartMeshIndices[vertex];
				unifiedIndices[i] = unifiedMeshIndices[originalMesh->firstColocal(vertex)];
			}
			Mesh::AddFaceResult::Enum result = m_mesh->addFace(indices);
			XA_UNUSED(result);
			XA_DEBUG_ASSERT(result == Mesh::AddFaceResult::OK);
#if XA_DEBUG
			// Unifying colocals may create degenerate edges. e.g. if two triangle vertices are colocal.
			for (int i = 0; i < 3; i++) {
				const uint32_t index1 = unifiedIndices[i];
				const uint32_t index2 = unifiedIndices[(i + 1) % 3];
				XA_DEBUG_ASSERT(index1 != index2);
			}
#endif
			result = m_unifiedMesh->addFace(unifiedIndices);
			XA_UNUSED(result);
			XA_DEBUG_ASSERT(result == Mesh::AddFaceResult::OK);
		}
		m_mesh->createBoundaries(); // For AtlasPacker::computeBoundingBox
		m_unifiedMesh->createBoundaries();
		m_unifiedMesh->linkBoundaries();
	}